

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressDXT.cpp
# Opt level: O1

void __thiscall nv::FastCompressor::compressDXT1a(FastCompressor *this,Private *outputOptions)

{
  OutputHandler *pOVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  BlockDXT1 block;
  ColorBlock rgba;
  BlockDXT1 local_78;
  ColorBlock local_70;
  
  uVar2 = Image::width(this->m_image);
  uVar3 = Image::height(this->m_image);
  ColorBlock::ColorBlock(&local_70);
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      if (uVar2 != 0) {
        uVar4 = 0;
        do {
          ColorBlock::init(&local_70,(EVP_PKEY_CTX *)this->m_image);
          QuickCompress::compressDXT1a(&local_70,&local_78);
          pOVar1 = outputOptions->outputHandler;
          if (pOVar1 != (OutputHandler *)0x0) {
            (*pOVar1->_vptr_OutputHandler[3])(pOVar1,&local_78,8);
          }
          uVar4 = uVar4 + 4;
        } while (uVar4 < uVar2);
      }
      uVar5 = uVar5 + 4;
    } while (uVar5 < uVar3);
  }
  return;
}

Assistant:

void nv::FastCompressor::compressDXT1a(const OutputOptions::Private & outputOptions)
{
	const uint w = m_image->width();
	const uint h = m_image->height();
	
	ColorBlock rgba;
	BlockDXT1 block;

	for (uint y = 0; y < h; y += 4) {
		for (uint x = 0; x < w; x += 4) {
			rgba.init(m_image, x, y);
			
			QuickCompress::compressDXT1a(rgba, &block);
			
			if (outputOptions.outputHandler != NULL) {
				outputOptions.outputHandler->writeData(&block, sizeof(block));
			}
		}
	}
}